

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<register_has_no_reset::AlwaysFFVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::GenericClassDefSymbol>
          (ASTVisitor<register_has_no_reset::AlwaysFFVisitor,_true,_true,_false,_false> *this,
          GenericClassDefSymbol *t)

{
  bool bVar1;
  DeclaredType *pDVar2;
  Expression *pEVar3;
  AlwaysFFVisitor *in_RDI;
  Type *spec;
  _Iterator<false> __end0;
  _Iterator<false> __begin0;
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
  *__range4;
  Expression *init;
  DeclaredType *declaredType;
  GenericClassDefSymbol *in_stack_ffffffffffffff90;
  Symbol *in_stack_ffffffffffffff98;
  Symbol *in_stack_ffffffffffffffa0;
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_symbols_ClassSymbols_h:223:47)>
  *in_stack_ffffffffffffffb0;
  DeclaredType *in_stack_ffffffffffffffd0;
  
  pDVar2 = Symbol::getDeclaredType(in_stack_ffffffffffffff98);
  if ((pDVar2 != (DeclaredType *)0x0) &&
     (pEVar3 = DeclaredType::getInitializer(in_stack_ffffffffffffffd0), pEVar3 != (Expression *)0x0)
     ) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>
              ((Expression *)in_stack_ffffffffffffff90,in_RDI);
  }
  GenericClassDefSymbol::specializations(in_stack_ffffffffffffff90);
  std::ranges::
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
  ::begin(in_stack_ffffffffffffffb0);
  std::ranges::
  transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
  ::end(in_stack_ffffffffffffffb0);
  while (bVar1 = std::ranges::operator==
                           ((_Iterator<false> *)in_stack_ffffffffffffff90,(_Iterator<false> *)in_RDI
                           ), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff90 =
         (GenericClassDefSymbol *)
         std::ranges::
         transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
         ::_Iterator<false>::operator*((_Iterator<false> *)in_stack_ffffffffffffff90);
    Symbol::visit<register_has_no_reset::AlwaysFFVisitor&>
              (in_stack_ffffffffffffffa0,(AlwaysFFVisitor *)in_stack_ffffffffffffff98);
    std::ranges::
    transform_view<std::ranges::ref_view<boost::unordered::unordered_flat_map<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/symbols/ClassSymbols.h:223:47)>
    ::_Iterator<false>::operator++((_Iterator<false> *)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }